

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ugen.c
# Opt level: O0

void ugen_done_graph(_dspcontext *dc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _dspcontext *p_Var4;
  t_pd sig;
  _vinlet *x;
  _sigoutconnect *p_Var5;
  _ugenbox *fatso;
  _dspcontext *p_Var6;
  uint uVar7;
  char *pcVar8;
  t_signal *ptVar9;
  int local_100;
  undefined8 *local_f0;
  t_int *ip;
  t_signal **iosigs;
  t_pd *zz_2;
  t_signal *s3;
  t_signal **sigp_1;
  t_signal **outsigs;
  t_pd *zz_1;
  t_signal **sigp;
  int realoverlap;
  t_pd *zz;
  int local_98;
  int upsample;
  int downsample;
  int switched;
  int reblock;
  int chainafterall;
  int chainblockend;
  int chainblockbegin;
  t_float srate;
  int calcsize;
  int vecsize;
  int phase;
  int frequency;
  int period;
  int parent_vecsize;
  t_float parent_srate;
  _dspcontext *parent_context;
  t_block *blk;
  int n;
  int i;
  t_sigoutconnect *oc2;
  t_sigoutconnect *oc;
  t_siginlet *uin;
  t_sigoutlet *uout;
  t_ugenbox *u;
  _dspcontext *dc_local;
  
  p_Var4 = dc->dc_parentcontext;
  downsample = 0;
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    post("ugen_done_graph...");
    for (uout = (t_sigoutlet *)dc->dc_ugenlist; uout != (t_sigoutlet *)0x0;
        uout = (t_sigoutlet *)uout[1].o_signal) {
      pcVar8 = class_getname((_class *)(uout[1].o_connections)->oc_who);
      post("ugen: %s",pcVar8);
      uin = (t_siginlet *)uout->o_connections;
      for (blk._4_4_ = 0; (int)blk._4_4_ < uout[1].o_nconnect; blk._4_4_ = blk._4_4_ + 1) {
        for (oc2 = *(t_sigoutconnect **)(uin + 1); oc2 != (t_sigoutconnect *)0x0; oc2 = oc2->oc_next
            ) {
          pcVar8 = class_getname((oc2->oc_who->u_obj->te_g).g_pd);
          uVar7 = ugen_index(dc,oc2->oc_who);
          post("... out %d to %s, index %d, inlet %d",(ulong)blk._4_4_,pcVar8,(ulong)uVar7,
               (ulong)(uint)oc2->oc_inno);
        }
        uin = (t_siginlet *)&uin[1].i_signal;
      }
    }
  }
  uout = (t_sigoutlet *)dc->dc_ugenlist;
  parent_context = (_dspcontext *)0x0;
  for (; uout != (t_sigoutlet *)0x0; uout = (t_sigoutlet *)uout[1].o_signal) {
    p_Var6 = parent_context;
    if (((_class *)((_dspcontext *)uout[1].o_connections)->dc_ugenlist == block_class) &&
       (p_Var6 = (_dspcontext *)uout[1].o_connections, parent_context != (_dspcontext *)0x0)) {
      pd_error(parent_context,"conflicting block~ and/or switch~ objects in same window");
      p_Var6 = parent_context;
    }
    parent_context = p_Var6;
  }
  if (p_Var4 == (_dspcontext *)0x0) {
    period = (int)sys_getsr();
    frequency = sys_getblksize();
  }
  else {
    period = (int)p_Var4->dc_srate;
    frequency = p_Var4->dc_vecsize;
  }
  if (parent_context == (_dspcontext *)0x0) {
    chainblockend = period;
    srate = (t_float)frequency;
    if (p_Var4 == (_dspcontext *)0x0) {
      local_100 = frequency;
    }
    else {
      local_100 = p_Var4->dc_calcsize;
    }
    chainblockbegin = local_100;
    zz._4_4_ = 1;
    local_98 = 1;
    vecsize = 1;
    phase = 1;
    downsample = (int)(p_Var4 == (_dspcontext *)0x0);
    upsample = 0;
  }
  else {
    srate = *(t_float *)&parent_context[1].dc_ugenlist;
    if (srate == 0.0) {
      srate = (t_float)frequency;
    }
    chainblockbegin = *(int *)((long)&parent_context[1].dc_ugenlist + 4);
    if (chainblockbegin == 0) {
      chainblockbegin = (int)srate;
    }
    sigp._4_4_ = *(t_float *)&parent_context[1].dc_parentcontext;
    if ((int)srate < (int)sigp._4_4_) {
      sigp._4_4_ = srate;
    }
    local_98 = *(int *)&parent_context[2].dc_ugenlist;
    zz._4_4_ = *(int *)&parent_context[1].dc_toplevel;
    if (frequency < local_98) {
      local_98 = frequency;
    }
    phase = ((int)srate * local_98) / (frequency * (int)sigp._4_4_ * zz._4_4_);
    vecsize = (frequency * (int)sigp._4_4_ * zz._4_4_) / ((int)srate * local_98);
    chainblockend =
         (int)(((float)period * (float)(int)sigp._4_4_ * (float)zz._4_4_) / (float)local_98);
    if (phase < 1) {
      phase = 1;
    }
    if (vecsize < 1) {
      vecsize = 1;
    }
    parent_context[1].dc_noutlets = vecsize;
    parent_context[1].dc_ninlets = phase;
    *(uint *)((long)&parent_context[1].dc_parentcontext + 4) =
         *(uint *)(pd_maininstance.pd_ugen + 0x130) & phase - 1U;
    if ((((p_Var4 == (_dspcontext *)0x0) || (sigp._4_4_ != 1.4013e-45)) ||
        (srate != (t_float)frequency)) || ((local_98 != 1 || (zz._4_4_ != 1)))) {
      downsample = 1;
    }
    upsample = (int)(char)parent_context[1].dc_calcsize;
  }
  dc->dc_reblock = (char)downsample;
  dc->dc_switched = (char)upsample;
  dc->dc_srate = (t_float)chainblockend;
  dc->dc_vecsize = (int)srate;
  dc->dc_calcsize = chainblockbegin;
  if ((dc->dc_iosigs != (t_signal **)0x0) && ((upsample != 0 || (downsample != 0)))) {
    blk._4_4_ = 0;
    zz_1 = (t_pd *)(dc->dc_iosigs + dc->dc_ninlets);
    for (; (int)blk._4_4_ < dc->dc_noutlets; blk._4_4_ = blk._4_4_ + 1) {
      if (((int)(*zz_1)->c_size != 0) && ((*zz_1)->c_methods == (t_methodentry *)0x0)) {
        sig = *zz_1;
        ptVar9 = signal_new(frequency,(t_float)period);
        signal_setborrowed((t_signal *)sig,ptVar9);
        *(int *)((long)&(*zz_1)->c_externdir + 4) = *(int *)((long)&(*zz_1)->c_externdir + 4) + 1;
        if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
          post("set %lx->%lx",*zz_1,(*zz_1)->c_methods);
        }
      }
      zz_1 = zz_1 + 1;
    }
  }
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    post("reblock %d, switched %d",(ulong)(uint)downsample,(ulong)(uint)upsample);
  }
  for (uout = (t_sigoutlet *)dc->dc_ugenlist; uout != (t_sigoutlet *)0x0;
      uout = (t_sigoutlet *)uout[1].o_signal) {
    x = (_vinlet *)uout[1].o_connections;
    sigp_1 = dc->dc_iosigs;
    if (sigp_1 != (t_signal **)0x0) {
      sigp_1 = sigp_1 + dc->dc_ninlets;
    }
    if ((x->x_obj).te_g.g_pd == vinlet_class) {
      vinlet_dspprolog(x,dc->dc_iosigs,(int)srate,chainblockbegin,
                       *(int *)(pd_maininstance.pd_ugen + 0x130),phase,vecsize,local_98,zz._4_4_,
                       downsample,upsample);
    }
    else if ((x->x_obj).te_g.g_pd == voutlet_class) {
      voutlet_dspprolog((_voutlet *)x,sigp_1,(int)srate,chainblockbegin,
                        *(int *)(pd_maininstance.pd_ugen + 0x130),phase,vecsize,local_98,zz._4_4_,
                        downsample,upsample);
    }
  }
  iVar1 = *(int *)(pd_maininstance.pd_ugen + 8);
  if ((parent_context != (_dspcontext *)0x0) && ((downsample != 0 || (upsample != 0)))) {
    dsp_add(block_prolog,1,parent_context);
    *(int *)((long)&parent_context[1].dc_iosigs + 4) = *(int *)(pd_maininstance.pd_ugen + 8) + -1;
  }
  for (uout = (t_sigoutlet *)dc->dc_ugenlist; uout != (t_sigoutlet *)0x0;
      uout = (t_sigoutlet *)uout[1].o_signal) {
    uout[2].o_nconnect = 0;
    uin = (t_siginlet *)uout->o_connections;
    blk._4_4_ = uout[1].o_nconnect;
    while (blk._4_4_ != 0) {
      uin->i_ngot = 0;
      uin = (t_siginlet *)&uin[1].i_signal;
      blk._4_4_ = blk._4_4_ + -1;
    }
    oc = *(t_sigoutconnect **)uout;
    blk._4_4_ = *(int *)&uout->o_signal;
    while (blk._4_4_ != 0) {
      *(undefined4 *)((long)&oc->oc_who + 4) = 0;
      *(undefined8 *)&oc->oc_inno = 0;
      oc = (t_sigoutconnect *)&oc->oc_next;
      blk._4_4_ = blk._4_4_ + -1;
    }
  }
  for (uout = (t_sigoutlet *)dc->dc_ugenlist; uout != (t_sigoutlet *)0x0;
      uout = (t_sigoutlet *)uout[1].o_signal) {
    if (uout[2].o_nconnect == 0) {
      oc = *(t_sigoutconnect **)uout;
      blk._4_4_ = *(int *)&uout->o_signal;
      while (blk._4_4_ != 0) {
        if (*(int *)&oc->oc_who != 0) goto LAB_00144902;
        oc = (t_sigoutconnect *)&oc->oc_next;
        blk._4_4_ = blk._4_4_ + -1;
      }
      ugen_doit(dc,(t_ugenbox *)uout);
    }
LAB_00144902:
  }
  uout = (t_sigoutlet *)dc->dc_ugenlist;
  while( true ) {
    if (uout == (t_sigoutlet *)0x0) goto LAB_00144a71;
    if (uout[2].o_nconnect == 0) break;
    uout = (t_sigoutlet *)uout[1].o_signal;
  }
  pd_error(uout[1].o_connections,"DSP loop detected (some tilde objects not scheduled)");
  blk._4_4_ = 0;
  s3 = (t_signal *)(dc->dc_iosigs + dc->dc_ninlets);
  for (; (int)blk._4_4_ < dc->dc_noutlets; blk._4_4_ = blk._4_4_ + 1) {
    if ((*(int *)(*(long *)s3 + 0x18) != 0) && (*(long *)(*(long *)s3 + 0x20) == 0)) {
      ptVar9 = signal_new(frequency,(t_float)period);
      signal_setborrowed(*(t_signal **)s3,ptVar9);
      *(int *)(*(long *)s3 + 0x14) = *(int *)(*(long *)s3 + 0x14) + 1;
      dsp_add_zero(ptVar9->s_vec,ptVar9->s_n);
      if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
        post("oops, belatedly set %lx->%lx",*(undefined8 *)s3,*(undefined8 *)(*(long *)s3 + 0x20));
      }
    }
    s3 = (t_signal *)&s3->s_vec;
  }
LAB_00144a71:
  if ((parent_context != (_dspcontext *)0x0) && ((downsample != 0 || (upsample != 0)))) {
    dsp_add(block_epilog,1,parent_context);
  }
  iVar2 = *(int *)(pd_maininstance.pd_ugen + 8);
  for (uout = (t_sigoutlet *)dc->dc_ugenlist; uout != (t_sigoutlet *)0x0;
      uout = (t_sigoutlet *)uout[1].o_signal) {
    if ((((_voutlet *)uout[1].o_connections)->x_obj).te_g.g_pd == voutlet_class) {
      ip = (t_int *)dc->dc_iosigs;
      if ((t_signal **)ip != (t_signal **)0x0) {
        ip = (t_int *)((t_signal **)ip + dc->dc_ninlets);
      }
      voutlet_dspepilog((_voutlet *)uout[1].o_connections,(t_signal **)ip,(int)srate,chainblockbegin
                        ,*(int *)(pd_maininstance.pd_ugen + 0x130),phase,vecsize,local_98,zz._4_4_,
                        downsample,upsample);
    }
  }
  iVar3 = *(int *)(pd_maininstance.pd_ugen + 8);
  if (parent_context != (_dspcontext *)0x0) {
    parent_context[1].dc_srate = (t_float)(iVar2 - iVar1);
    parent_context[1].dc_vecsize = iVar3 - iVar2;
    *(char *)((long)&parent_context[1].dc_calcsize + 2) = (char)downsample;
  }
  if (*(int *)(pd_maininstance.pd_ugen + 0x134) != 0) {
    if (dc->dc_parentcontext == (_dspcontext *)0x0) {
      local_f0 = *(undefined8 **)pd_maininstance.pd_ugen;
      blk._4_4_ = *(int *)(pd_maininstance.pd_ugen + 8);
      while (blk._4_4_ != 0) {
        post("chain %lx",*local_f0);
        local_f0 = local_f0 + 1;
        blk._4_4_ = blk._4_4_ + -1;
      }
    }
    post("... ugen_done_graph done.");
  }
  while (dc->dc_ugenlist != (_ugenbox *)0x0) {
    uin = (t_siginlet *)dc->dc_ugenlist->u_out;
    blk._0_4_ = dc->dc_ugenlist->u_nout;
    while ((int)blk != 0) {
      oc2 = *(t_sigoutconnect **)(uin + 1);
      while (oc2 != (t_sigoutconnect *)0x0) {
        p_Var5 = oc2->oc_next;
        freebytes(oc2,0x18);
        oc2 = p_Var5;
      }
      uin = (t_siginlet *)&uin[1].i_signal;
      blk._0_4_ = (int)blk + -1;
    }
    freebytes(dc->dc_ugenlist->u_out,(long)dc->dc_ugenlist->u_nout * 0x18);
    freebytes(dc->dc_ugenlist->u_in,(long)dc->dc_ugenlist->u_nin << 4);
    fatso = dc->dc_ugenlist;
    dc->dc_ugenlist = fatso->u_next;
    freebytes(fatso,0x38);
  }
  if (*(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) == dc) {
    *(_dspcontext **)(pd_maininstance.pd_ugen + 0x138) = dc->dc_parentcontext;
  }
  else {
    bug("THIS->u_context");
  }
  freebytes(dc,0x30);
  return;
}

Assistant:

void ugen_done_graph(t_dspcontext *dc)
{
    t_ugenbox *u;
    t_sigoutlet *uout;
    t_siginlet *uin;
    t_sigoutconnect *oc, *oc2;
    int i, n;
    t_block *blk;
    t_dspcontext *parent_context = dc->dc_parentcontext;
    t_float parent_srate;
    int parent_vecsize;
    int period, frequency, phase, vecsize, calcsize;
    t_float srate;
    int chainblockbegin;    /* DSP chain onset before block prolog code */
    int chainblockend;      /* and after block epilog code */
    int chainafterall;      /* and after signal outlet epilog */
    int reblock = 0, switched;
    int downsample = 1, upsample = 1;
    /* debugging printout */

    if (THIS->u_loud)
    {
        post("ugen_done_graph...");
        for (u = dc->dc_ugenlist; u; u = u->u_next)
        {
            post("ugen: %s", class_getname(u->u_obj->ob_pd));
            for (uout = u->u_out, i = 0; i < u->u_nout; uout++, i++)
                for (oc = uout->o_connections; oc; oc = oc->oc_next)
            {
                post("... out %d to %s, index %d, inlet %d", i,
                    class_getname(oc->oc_who->u_obj->ob_pd),
                        ugen_index(dc, oc->oc_who), oc->oc_inno);
            }
        }
    }

        /* search for an object of class "block~" */
    for (u = dc->dc_ugenlist, blk = 0; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == block_class)
        {
            if (blk)
                pd_error(blk, "conflicting block~ and/or switch~ objects in same window");
            else blk = (t_block *)zz;
        }
    }

        /* figure out block size, calling frequency, sample rate */
    if (parent_context)
    {
        parent_srate = parent_context->dc_srate;
        parent_vecsize = parent_context->dc_vecsize;
    }
    else
    {
        parent_srate = sys_getsr();
        parent_vecsize = sys_getblksize();
    }
    if (blk)
    {
        int realoverlap;
        vecsize = blk->x_vecsize;
        if (vecsize == 0)
            vecsize = parent_vecsize;
        calcsize = blk->x_calcsize;
        if (calcsize == 0)
            calcsize = vecsize;
        realoverlap = blk->x_overlap;
        if (realoverlap > vecsize) realoverlap = vecsize;
        downsample = blk->x_downsample;
        upsample   = blk->x_upsample;
        if (downsample > parent_vecsize)
            downsample = parent_vecsize;
        period = (vecsize * downsample)/
            (parent_vecsize * realoverlap * upsample);
        frequency = (parent_vecsize * realoverlap * upsample)/
            (vecsize * downsample);
        phase = blk->x_phase;
        srate = parent_srate * realoverlap * upsample / downsample;
        if (period < 1) period = 1;
        if (frequency < 1) frequency = 1;
        blk->x_frequency = frequency;
        blk->x_period = period;
        blk->x_phase = THIS->u_phase & (period - 1);
        if (! parent_context || (realoverlap != 1) ||
            (vecsize != parent_vecsize) ||
                (downsample != 1) || (upsample != 1))
                    reblock = 1;
        switched = blk->x_switched;
    }
    else
    {
        srate = parent_srate;
        vecsize = parent_vecsize;
        calcsize = (parent_context ? parent_context->dc_calcsize : vecsize);
        downsample = upsample = 1;
        period = frequency = 1;
        phase = 0;
        if (!parent_context) reblock = 1;
        switched = 0;
    }
    dc->dc_reblock = reblock;
    dc->dc_switched = switched;
    dc->dc_srate = srate;
    dc->dc_vecsize = vecsize;
    dc->dc_calcsize = calcsize;

        /* if we're reblocking or switched, we now have to create output
        signals to fill in for the "borrowed" ones we have now.  This
        is also possibly true even if we're not blocked/switched, in
        the case that there was a signal loop.  But we don't know this
        yet.  */

    if (dc->dc_iosigs && (switched || reblock))
    {
        t_signal **sigp;
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                signal_setborrowed(*sigp,
                    signal_new(parent_vecsize, parent_srate));
                (*sigp)->s_refcount++;

                if (THIS->u_loud) post("set %lx->%lx", *sigp,
                    (*sigp)->s_borrowedfrom);
            }
        }
    }

    if (THIS->u_loud)
        post("reblock %d, switched %d", reblock, switched);

        /* schedule prologs for inlets and outlets.  If the "reblock" flag
        is set, an inlet will put code on the DSP chain to copy its input
        into an internal buffer here, before any unit generators' DSP code
        gets scheduled.  If we don't "reblock", inlets will need to get
        pointers to their corresponding inlets/outlets on the box we're inside,
        if any.  Outlets will also need pointers, unless we're switched, in
        which case outlet epilog code will kick in. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        t_signal **outsigs = dc->dc_iosigs;
        if (outsigs) outsigs += dc->dc_ninlets;

        if (pd_class(zz) == vinlet_class)
            vinlet_dspprolog((struct _vinlet *)zz,
                dc->dc_iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        else if (pd_class(zz) == voutlet_class)
            voutlet_dspprolog((struct _voutlet *)zz,
                outsigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
    }
    chainblockbegin = THIS->u_dspchainsize;

    if (blk && (reblock || switched))   /* add the block DSP prolog */
    {
        dsp_add(block_prolog, 1, blk);
        blk->x_chainonset = THIS->u_dspchainsize - 1;
    }
        /* Initialize for sorting */
    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        u->u_done = 0;
        for (uout = u->u_out, i = u->u_nout; i--; uout++)
            uout->o_nsent = 0;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            uin->i_ngot = 0, uin->i_signal = 0;
   }

        /* Do the sort */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
            /* check that we have no connected signal inlets */
        if (u->u_done) continue;
        for (uin = u->u_in, i = u->u_nin; i--; uin++)
            if (uin->i_nconnect) goto next;

        ugen_doit(dc, u);
    next: ;
    }

        /* check for a DSP loop, which is evidenced here by the presence
        of ugens not yet scheduled. */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
        if (!u->u_done)
    {
        t_signal **sigp;
        pd_error(u->u_obj,
            "DSP loop detected (some tilde objects not scheduled)");
                /* this might imply that we have unfilled "borrowed" outputs
                which we'd better fill in now. */
        for (i = 0, sigp = dc->dc_iosigs + dc->dc_ninlets; i < dc->dc_noutlets;
            i++, sigp++)
        {
            if ((*sigp)->s_isborrowed && !(*sigp)->s_borrowedfrom)
            {
                t_signal *s3 = signal_new(parent_vecsize, parent_srate);
                signal_setborrowed(*sigp, s3);
                (*sigp)->s_refcount++;
                dsp_add_zero(s3->s_vec, s3->s_n);
                if (THIS->u_loud)
                    post("oops, belatedly set %lx->%lx", *sigp,
                        (*sigp)->s_borrowedfrom);
            }
        }
        break;   /* don't need to keep looking. */
    }

    if (blk && (reblock || switched))    /* add block DSP epilog */
        dsp_add(block_epilog, 1, blk);
    chainblockend = THIS->u_dspchainsize;

        /* add epilogs for outlets.  */

    for (u = dc->dc_ugenlist; u; u = u->u_next)
    {
        t_pd *zz = &u->u_obj->ob_pd;
        if (pd_class(zz) == voutlet_class)
        {
            t_signal **iosigs = dc->dc_iosigs;
            if (iosigs) iosigs += dc->dc_ninlets;
            voutlet_dspepilog((struct _voutlet *)zz,
                iosigs, vecsize, calcsize, THIS->u_phase, period, frequency,
                    downsample, upsample, reblock, switched);
        }
    }

    chainafterall = THIS->u_dspchainsize;
    if (blk)
    {
        blk->x_blocklength = chainblockend - chainblockbegin;
        blk->x_epiloglength = chainafterall - chainblockend;
        blk->x_reblock = reblock;
    }

    if (THIS->u_loud)
    {
        t_int *ip;
        if (!dc->dc_parentcontext)
            for (i = THIS->u_dspchainsize, ip = THIS->u_dspchain;
                i--; ip++)
                    post("chain %lx", *ip);
        post("... ugen_done_graph done.");
    }
        /* now delete everything. */
    while (dc->dc_ugenlist)
    {
        for (uout = dc->dc_ugenlist->u_out, n = dc->dc_ugenlist->u_nout;
            n--; uout++)
        {
            oc = uout->o_connections;
            while (oc)
            {
                oc2 = oc->oc_next;
                freebytes(oc, sizeof *oc);
                oc = oc2;
            }
        }
        freebytes(dc->dc_ugenlist->u_out, dc->dc_ugenlist->u_nout *
            sizeof (*dc->dc_ugenlist->u_out));
        freebytes(dc->dc_ugenlist->u_in, dc->dc_ugenlist->u_nin *
            sizeof(*dc->dc_ugenlist->u_in));
        u = dc->dc_ugenlist;
        dc->dc_ugenlist = u->u_next;
        freebytes(u, sizeof *u);
    }
    if (THIS->u_context == dc)
        THIS->u_context = dc->dc_parentcontext;
    else bug("THIS->u_context");
    freebytes(dc, sizeof(*dc));

}